

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::Mapper<kj::Array<capnp::EnumSchema::Enumerant>_>::~Mapper
          (Mapper<kj::Array<capnp::EnumSchema::Enumerant>_> *this)

{
  Mapper<kj::Array<capnp::EnumSchema::Enumerant>_> *this_local;
  
  Array<capnp::EnumSchema::Enumerant>::~Array(&this->array);
  return;
}

Assistant:

Mapper(T&& array): array(kj::fwd<T>(array)) {}